

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O1

void __thiscall
slang::syntax::UdpEdgeFieldSyntax::setChild
          (UdpEdgeFieldSyntax *this,size_t index,TokenOrSyntax child)

{
  Token *pTVar1;
  Info *pIVar2;
  undefined1 uVar3;
  NumericTokenFlags NVar4;
  uint32_t uVar5;
  variant_alternative_t<0UL,_variant<Token,_const_SyntaxNode_*>_> *pvVar6;
  
  pvVar6 = std::get<0ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                     ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)&child);
  uVar3 = pvVar6->field_0x2;
  NVar4.raw = (pvVar6->numFlags).raw;
  uVar5 = pvVar6->rawLen;
  pIVar2 = pvVar6->info;
  pTVar1 = &this->openParen + index;
  pTVar1->kind = pvVar6->kind;
  pTVar1->field_0x2 = uVar3;
  pTVar1->numFlags = (NumericTokenFlags)NVar4.raw;
  pTVar1->rawLen = uVar5;
  pTVar1->info = pIVar2;
  return;
}

Assistant:

void UdpEdgeFieldSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: openParen = child.token(); return;
        case 1: first = child.token(); return;
        case 2: second = child.token(); return;
        case 3: closeParen = child.token(); return;
        default: SLANG_UNREACHABLE;
    }
}